

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_class(Parser *parser,Modifier *modifier)

{
  Kind KVar1;
  Token *name;
  Token *data;
  List *list;
  BlockStmt *block;
  ClassStmt *pCVar2;
  
  name = parser->token;
  expect(parser,ID);
  while (parser->token->kind == NEWLINE) {
    move(parser);
  }
  list = new_list();
  if (parser->token->kind == COLON) {
    bmove(parser);
    data = parser->token;
    KVar1 = data->kind;
    while (KVar1 != OP_FL_BRA) {
      expect(parser,ID);
      list_add(list,data);
      data = parser->token;
      KVar1 = data->kind;
      if (KVar1 == COMM) {
        bmove(parser);
        data = parser->token;
        KVar1 = data->kind;
      }
    }
  }
  block = (BlockStmt *)parse_class_block(parser);
  pCVar2 = new_class_stmt(name,list,block,modifier);
  return pCVar2;
}

Assistant:

void *parse_class(Parser *parser, Modifier *modifier) {
    Token *name = token(parser);
    expect(parser, ID);
    break_newline(parser);
    List *extends = new_list();
    // 解析继承关系
    if (token(parser)->kind == COLON) {
        bmove(parser);
        Token *super;
        while ((super = token(parser))->kind != OP_FL_BRA) {
            expect(parser, ID);
            list_add(extends, super);
            if (token(parser)->kind == COMM){
                bmove(parser);
            }
        }
    }
    BlockStmt *block = parse_class_block(parser);
    return new_class_stmt(name, extends, block, modifier);
}